

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void int64_suite::test_zero(void)

{
  value vVar1;
  undefined4 uVar2;
  value_type input [9];
  decoder decoder;
  undefined4 local_74;
  return_type local_70;
  uchar local_68 [16];
  decoder local_58;
  
  local_58.input._M_str = local_68;
  local_68[8] = 0;
  local_68[0] = 0xd6;
  local_68[1] = '\0';
  local_68[2] = '\0';
  local_68[3] = '\0';
  local_68[4] = '\0';
  local_68[5] = '\0';
  local_68[6] = '\0';
  local_68[7] = '\0';
  local_58.input._M_len = 9;
  local_58.current.view._M_len = 0;
  local_58.current.view._M_str = (uchar *)0x0;
  local_58.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_58);
  local_70._0_4_ = local_58.current.code;
  local_74 = 0xd6;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::int64",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x1ea,"void int64_suite::test_zero()",&local_70,&local_74);
  local_70._0_4_ = trial::protocol::bintoken::token::symbol::convert(local_58.current.code);
  local_74 = 4;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x1eb,"void int64_suite::test_zero()",&local_70,&local_74);
  vVar1 = trial::protocol::bintoken::token::symbol::convert(local_58.current.code);
  uVar2 = 0;
  if (vVar1 - null < 0xc) {
    uVar2 = *(undefined4 *)(&DAT_00124a00 + (ulong)(vVar1 - null) * 4);
  }
  local_70 = CONCAT44(local_70._4_4_,uVar2);
  local_74 = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x1ec,"void int64_suite::test_zero()",&local_70,&local_74);
  local_70 = trial::protocol::bintoken::detail::decoder::
             overloader<trial::protocol::bintoken::token::int64>::decode(&local_58);
  local_74 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("decoder.value<token::int64>()","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x1ed,"void int64_suite::test_zero()",&local_70,&local_74);
  trial::protocol::bintoken::detail::decoder::next(&local_58);
  local_70 = CONCAT44(local_70._4_4_,local_58.current.code);
  local_74 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x1ef,"void int64_suite::test_zero()",&local_70,&local_74);
  return;
}

Assistant:

void test_zero()
{
    const value_type input[] = { token::code::int64, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::int64);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::data);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.value<token::int64>(), 0);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}